

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O2

int csp_if_udp_rx_work(int sockfd,size_t unused,csp_iface_t *iface)

{
  int iVar1;
  int iVar2;
  csp_packet_t *packet;
  ssize_t sVar3;
  
  packet = csp_buffer_get(0);
  iVar2 = -1;
  if (packet != (csp_packet_t *)0x0) {
    iVar1 = csp_id_setup_rx(packet);
    sVar3 = recvfrom(sockfd,packet->frame_begin,(long)iVar1 + 0x100,0x100,(sockaddr *)0x0,
                     (socklen_t *)0x0);
    if ((int)sVar3 < iVar1) {
      csp_buffer_free(packet);
    }
    else {
      packet->frame_length = (uint16_t)sVar3;
      iVar2 = csp_id_strip(packet);
      if (iVar2 == 0) {
        iVar2 = 0;
        csp_qfifo_write(packet,iface,(void *)0x0);
      }
      else {
        csp_buffer_free(packet);
        iVar2 = -2;
      }
    }
  }
  return iVar2;
}

Assistant:

int csp_if_udp_rx_work(int sockfd, size_t unused, csp_iface_t * iface) {

	csp_packet_t * packet = csp_buffer_get(0);
	if (packet == NULL) {
		return CSP_ERR_NOMEM;
	}

	/* Setup RX frane to point to ID */
	int header_size = csp_id_setup_rx(packet);
	int received_len = recvfrom(sockfd, (char *)packet->frame_begin, sizeof(packet->data) + header_size, MSG_WAITALL, NULL, NULL);
	
	if (received_len < header_size) {
		csp_buffer_free(packet);
		return CSP_ERR_NOMEM;
	}

	packet->frame_length = received_len;

	/* Parse the frame and strip the ID field */
	if (csp_id_strip(packet) != 0) {
		csp_buffer_free(packet);
		return CSP_ERR_INVAL;
	}

	csp_qfifo_write(packet, iface, NULL);

	return CSP_ERR_NONE;
}